

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_descriptor.cpp
# Opt level: O0

void __thiscall Descriptor_Parse_pkh_extkey_Test::TestBody(Descriptor_Parse_pkh_extkey_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *rhs;
  AssertHelper local_5f8;
  Message local_5f0;
  string local_5e8 [32];
  undefined1 local_5c8 [8];
  AssertionResult gtest_ar_2;
  Message local_5b0;
  undefined1 local_5a8 [8];
  AssertionResult gtest_ar_1;
  Message local_590;
  string local_588 [32];
  AssertHelper local_568;
  Message local_560;
  Script local_558;
  AssertHelper local_520;
  Message local_518 [2];
  string local_508 [384];
  AssertionResult gtest_ar;
  CfdException *except;
  allocator local_209;
  string local_208 [8];
  string desc_str;
  Script locking_script;
  Descriptor desc;
  allocator local_31;
  string local_30 [8];
  string descriptor;
  Descriptor_Parse_pkh_extkey_Test *this_local;
  
  descriptor.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_30,
             "pkh(xpub68Gmy5EdvgibQVfPdqkBBCHxA5htiqg55crXYuXoQRKfDBFA1WEjWgP6LHhwBZeNK1VTsfTFUHCdrfp1bgwQ9xv5ski8PX9rL2dZXvgGDnw/1/2)"
             ,&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  cfd::core::Descriptor::Descriptor
            ((Descriptor *)
             &locking_script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::Script::Script((Script *)((long)&desc_str.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_208,"",&local_209);
  std::allocator<char>::~allocator((allocator<char> *)&local_209);
  cfd::core::Descriptor::Parse((string *)&except,(vector *)local_30);
  cfd::core::Descriptor::operator=
            ((Descriptor *)
             &locking_script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(Descriptor *)&except);
  cfd::core::Descriptor::~Descriptor((Descriptor *)&except);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::Parse(local_508,(vector *)local_30);
      cfd::core::Descriptor::operator=
                ((Descriptor *)
                 &locking_script.script_stack_.
                  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(Descriptor *)local_508);
      cfd::core::Descriptor::~Descriptor((Descriptor *)local_508);
    }
  }
  else {
    testing::Message::Message(local_518);
    testing::internal::AssertHelper::AssertHelper
              (&local_520,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_descriptor.cpp"
               ,0x1cf,
               "Expected: desc = Descriptor::Parse(descriptor) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_520,local_518);
    testing::internal::AssertHelper::~AssertHelper(&local_520);
    testing::Message::~Message(local_518);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::GetLockingScript();
      cfd::core::Script::operator=((Script *)((long)&desc_str.field_2 + 8),&local_558);
      cfd::core::Script::~Script(&local_558);
    }
  }
  else {
    testing::Message::Message(&local_560);
    testing::internal::AssertHelper::AssertHelper
              (&local_568,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_descriptor.cpp"
               ,0x1d0,
               "Expected: locking_script = desc.GetLockingScript() doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_568,&local_560);
    testing::internal::AssertHelper::~AssertHelper(&local_568);
    testing::Message::~Message(&local_560);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::ToString_abi_cxx11_(SUB81(local_588,0));
      std::__cxx11::string::operator=(local_208,local_588);
      std::__cxx11::string::~string(local_588);
    }
  }
  else {
    testing::Message::Message(&local_590);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_descriptor.cpp"
               ,0x1d1,
               "Expected: desc_str = desc.ToString(false) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_590);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_590);
  }
  pcVar2 = (char *)std::__cxx11::string::c_str();
  rhs = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_5a8,"desc_str.c_str()","descriptor.c_str()",pcVar2,rhs);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5a8);
  if (!bVar1) {
    testing::Message::Message(&local_5b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_5a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_descriptor.cpp"
               ,0x1d2,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_5b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_5b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5a8);
  cfd::core::Script::ToString_abi_cxx11_();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_5c8,"locking_script.ToString().c_str()",
             "\"OP_DUP OP_HASH160 f833c08f02389c451ae35ec797fccf7f396616bf OP_EQUALVERIFY OP_CHECKSIG\""
             ,pcVar2,
             "OP_DUP OP_HASH160 f833c08f02389c451ae35ec797fccf7f396616bf OP_EQUALVERIFY OP_CHECKSIG"
            );
  std::__cxx11::string::~string(local_5e8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5c8);
  if (!bVar1) {
    testing::Message::Message(&local_5f0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_5c8);
    testing::internal::AssertHelper::AssertHelper
              (&local_5f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_descriptor.cpp"
               ,0x1d3,pcVar2);
    testing::internal::AssertHelper::operator=(&local_5f8,&local_5f0);
    testing::internal::AssertHelper::~AssertHelper(&local_5f8);
    testing::Message::~Message(&local_5f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5c8);
  std::__cxx11::string::~string(local_208);
  cfd::core::Script::~Script((Script *)((long)&desc_str.field_2 + 8));
  cfd::core::Descriptor::~Descriptor
            ((Descriptor *)
             &locking_script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

TEST(Descriptor, Parse_pkh_extkey) {
  // m/1'/2 -> m/1/2 : hardened is privkey only.
  std::string descriptor = "pkh(xpub68Gmy5EdvgibQVfPdqkBBCHxA5htiqg55crXYuXoQRKfDBFA1WEjWgP6LHhwBZeNK1VTsfTFUHCdrfp1bgwQ9xv5ski8PX9rL2dZXvgGDnw/1/2)";
  Descriptor desc;
  Script locking_script;
  std::string desc_str = "";

  try {
    desc = Descriptor::Parse(descriptor);
  } catch (const CfdException& except) {
    EXPECT_STREQ(except.what(), "");
  }
  EXPECT_NO_THROW(desc = Descriptor::Parse(descriptor));
  EXPECT_NO_THROW(locking_script = desc.GetLockingScript());
  EXPECT_NO_THROW(desc_str = desc.ToString(false));
  EXPECT_STREQ(desc_str.c_str(), descriptor.c_str());
  EXPECT_STREQ(locking_script.ToString().c_str(), "OP_DUP OP_HASH160 f833c08f02389c451ae35ec797fccf7f396616bf OP_EQUALVERIFY OP_CHECKSIG");
}